

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmListCommand.cxx
# Opt level: O0

bool __thiscall
cmListCommand::FilterRegex
          (cmListCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,bool includeMatches,string *listName,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *varArgsExpanded)

{
  cmMakefile *this_00;
  bool bVar1;
  iterator __first;
  iterator __last;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  end;
  char *value_00;
  MatchesRegex __pred;
  cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_1b0;
  undefined1 local_1a0 [8];
  string value;
  undefined1 local_178;
  undefined3 uStack_177;
  iterator newArgsEnd;
  iterator argsEnd;
  iterator argsBegin;
  undefined1 local_140 [8];
  string error;
  undefined1 local_110 [8];
  RegularExpression regex;
  string *pattern;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *varArgsExpanded_local;
  string *listName_local;
  bool includeMatches_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  cmListCommand *this_local;
  
  regex._200_8_ =
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::operator[](args,4);
  cmsys::RegularExpression::RegularExpression
            ((RegularExpression *)local_110,(string *)regex._200_8_);
  bVar1 = cmsys::RegularExpression::is_valid((RegularExpression *)local_110);
  if (bVar1) {
    __first = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::begin(varArgsExpanded);
    __last = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end(varArgsExpanded);
    MatchesRegex::MatchesRegex
              ((MatchesRegex *)((long)&value.field_2 + 8),(RegularExpression *)local_110,
               includeMatches);
    __pred._12_4_ = 0;
    __pred.regex = (RegularExpression *)value.field_2._8_8_;
    __pred.includeMatches = (bool)local_178;
    __pred._9_3_ = uStack_177;
    end = std::
          remove_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,MatchesRegex>
                    (__first._M_current,__last._M_current,__pred);
    local_1b0 = cmMakeRange<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                          ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            )__first._M_current,end);
    cmJoin<cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
              ((string *)local_1a0,&local_1b0,";");
    this_00 = (this->super_cmCommand).Makefile;
    value_00 = (char *)std::__cxx11::string::c_str();
    cmMakefile::AddDefinition(this_00,listName,value_00);
    argsBegin._M_current._0_4_ = 1;
    std::__cxx11::string::~string((string *)local_1a0);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_140,"sub-command FILTER, mode REGEX ",
               (allocator<char> *)((long)&argsBegin._M_current + 7));
    std::allocator<char>::~allocator((allocator<char> *)((long)&argsBegin._M_current + 7));
    std::__cxx11::string::operator+=((string *)local_140,"failed to compile regex \"");
    std::__cxx11::string::operator+=((string *)local_140,(string *)regex._200_8_);
    std::__cxx11::string::operator+=((string *)local_140,"\".");
    cmCommand::SetError(&this->super_cmCommand,(string *)local_140);
    argsBegin._M_current._0_4_ = 1;
    std::__cxx11::string::~string((string *)local_140);
  }
  cmsys::RegularExpression::~RegularExpression((RegularExpression *)local_110);
  return bVar1;
}

Assistant:

bool cmListCommand::FilterRegex(std::vector<std::string> const& args,
                                bool includeMatches,
                                std::string const& listName,
                                std::vector<std::string>& varArgsExpanded)
{
  const std::string& pattern = args[4];
  cmsys::RegularExpression regex(pattern);
  if (!regex.is_valid()) {
    std::string error = "sub-command FILTER, mode REGEX ";
    error += "failed to compile regex \"";
    error += pattern;
    error += "\".";
    this->SetError(error);
    return false;
  }

  std::vector<std::string>::iterator argsBegin = varArgsExpanded.begin();
  std::vector<std::string>::iterator argsEnd = varArgsExpanded.end();
  std::vector<std::string>::iterator newArgsEnd =
    std::remove_if(argsBegin, argsEnd, MatchesRegex(regex, includeMatches));

  std::string value = cmJoin(cmMakeRange(argsBegin, newArgsEnd), ";");
  this->Makefile->AddDefinition(listName, value.c_str());
  return true;
}